

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.cc
# Opt level: O2

args_t parse(string *s)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  string *this;
  byte bVar5;
  runtime_error *this_00;
  char **extraout_RDX;
  ulong uVar6;
  string *in_RSI;
  ulong uVar7;
  args_t aVar8;
  value_type local_220;
  string *local_200;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  string str;
  ostringstream token;
  string local_1a0 [368];
  
  argv.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&argv;
  argv.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  argv.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       argv.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&token);
  local_200 = s;
  ensure_one_newline(&str,in_RSI);
  uVar7 = 0;
  uVar6 = (ulong)(uint)str._M_string_length;
  if ((int)(uint)str._M_string_length < 1) {
    uVar6 = uVar7;
  }
  bVar4 = false;
  bVar2 = false;
  bVar3 = false;
  bVar1 = 0;
  do {
    this = local_200;
    if (uVar6 == uVar7) {
      if (bVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Parse Error! Still in container\n");
      }
      else {
        if (!bVar3) {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1e0,&argv);
          args_t::args_t((args_t *)this,
                         (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_1e0);
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&local_1e0);
          std::__cxx11::string::~string((string *)&str);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&token);
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&argv.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          aVar8.argv = extraout_RDX;
          aVar8._0_8_ = this;
          return aVar8;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Parse Error! Unused escape (\\)\n");
      }
LAB_00108bf1:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar5 = str._M_dataplus._M_p[uVar7];
    if ((bVar5 - 9 < 2) || (bVar5 == 0x20)) {
      if (bVar4) {
        if (bVar2) {
LAB_00108ae6:
          std::operator<<((ostream *)&token,bVar5);
        }
        else {
          if (bVar3) goto LAB_00108a3b;
          std::__cxx11::stringbuf::str();
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&argv,&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          local_220._M_string_length = 0;
          local_220.field_2._M_local_buf[0] = '\0';
          std::__cxx11::stringbuf::str(local_1a0);
          std::__cxx11::string::~string((string *)&local_220);
          bVar4 = false;
          std::ios::clear((int)*(undefined8 *)(_token + -0x18) + (int)&token);
        }
      }
    }
    else if ((bVar5 == 0x22) || (bVar5 == 0x27)) {
      if (bVar3) {
LAB_00108a3b:
        std::operator<<((ostream *)&token,bVar5);
        bVar3 = false;
      }
      else if (bVar4) {
        if (!bVar2) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Parse Error! Bad quotes");
          goto LAB_00108bf1;
        }
        if (bVar5 != bVar1) goto LAB_00108ae6;
        std::__cxx11::stringbuf::str();
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&argv,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        local_220._M_string_length = 0;
        local_220.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringbuf::str(local_1a0);
        std::__cxx11::string::~string((string *)&local_220);
        bVar4 = false;
        std::ios::clear((int)*(undefined8 *)(_token + -0x18) + (int)&token);
        bVar2 = false;
      }
      else {
        bVar4 = true;
        bVar2 = true;
        bVar1 = bVar5;
      }
    }
    else if (bVar5 == 0x5c) {
      if (((bVar2) && (bVar5 = 0x5c, str._M_dataplus._M_p[uVar7 + 1] != bVar1)) ||
         (bVar5 = 0x5c, bVar3)) goto LAB_00108ae6;
      bVar3 = true;
    }
    else {
      if (!bVar4) {
        bVar4 = true;
      }
      std::operator<<((ostream *)&token,bVar5);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

args_t parse(const string &s) {
    list<string> argv;
    ostringstream token;

    bool in_token;
    bool in_container;
    bool escaped;
    char container_start;
    char c;
    int len;
    int i;

    string str = ensure_one_newline(s);

    container_start = 0;
    in_token = false;
    in_container = false;
    escaped = false;

    len = static_cast<int>(str.length());

    for (i = 0; i < len; i++) {
        c = str[i];

        switch (c) {
            /* handle whitespace */
            case ' ':
            case '\t':
            case '\n':
                if (!in_token)
                    continue;

                if (in_container) {
                    token << c;
                    continue;
                }

                if (escaped) {
                    escaped = false;
                    token << c;
                    continue;
                }

                /* if reached here, we're at end of token */
                in_token = false;
                argv.push_back(token.str());
                token.str(string());
                token.clear();
                break;

                /* handle quotes */
            case '\'':
            case '\"':

                if (escaped) {
                    token << c;
                    escaped = false;
                    continue;
                }

                if (!in_token) {
                    in_token = true;
                    in_container = true;
                    container_start = c;
                    continue;
                }

                if (in_container) {
                    if (c == container_start) {
                        in_container = false;
                        in_token = false;
                        argv.push_back(token.str());
                        token.str(string());
                        token.clear();
                        continue;
                    } else {
                        token << c;
                        continue;
                    }
                }

                /* XXX in this case, we:
                 *    1. have a quote
                 *    2. are in a token
                 *    3. and not in a container
                 * e.g.
                 *    hell"o
                 *
                 * what'str done here appears shell-dependent,
                 * but overall, it'str an error.... i *think*
                 */
                throw runtime_error("Parse Error! Bad quotes");
            case '\\':

                if (in_container && str[i + 1] != container_start) {
                    token << c;
                    continue;
                }

                if (escaped) {
                    token << c;
                    continue;
                }

                escaped = true;
                break;

            default:
                if (!in_token) {
                    in_token = true;
                }

                token << c;
        }
    }

    if (in_container)
        throw runtime_error("Parse Error! Still in container\n");

    if (escaped)
        throw runtime_error("Parse Error! Unused escape (\\)\n");

    return args_t(argv);
}